

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvcStreamReader.cpp
# Opt level: O3

void __thiscall VVCStreamReader::incTimings(VVCStreamReader *this)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = (this->super_MPEGStreamReader).m_totalFrameNum;
  (this->super_MPEGStreamReader).m_totalFrameNum = iVar4 + 1;
  if (iVar4 < 1) {
    lVar1 = (this->super_MPEGStreamReader).m_curDts;
    lVar3 = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
  }
  else {
    lVar3 = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
    lVar1 = (this->super_MPEGStreamReader).m_curDts + lVar3;
    (this->super_MPEGStreamReader).m_curDts = lVar1;
  }
  iVar4 = this->m_frameNum;
  lVar5 = (long)iVar4 - (long)this->m_fullPicOrder;
  (this->super_MPEGStreamReader).m_curPts = lVar1 - lVar5 * lVar3;
  this->m_frameNum = iVar4 + 1;
  this->m_firstFrame = false;
  iVar4 = (int)lVar5;
  if (this->m_frameDepth < iVar4) {
    this->m_frameDepth = iVar4;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"B-pyramid level ",0x10);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->m_frameDepth + -1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," detected. Shift DTS to ",0x18);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_frameDepth);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," frames",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    sLastMsg = true;
  }
  return;
}

Assistant:

void VVCStreamReader::incTimings()
{
    if (m_totalFrameNum++ > 0)
        m_curDts += m_pcrIncPerFrame;
    const int delta = m_frameNum - m_fullPicOrder;
    m_curPts = m_curDts - delta * m_pcrIncPerFrame;
    m_frameNum++;
    m_firstFrame = false;

    if (delta > m_frameDepth)
    {
        m_frameDepth = delta;
        LTRACE(LT_INFO, 2,
               "B-pyramid level " << m_frameDepth - 1 << " detected. Shift DTS to " << m_frameDepth << " frames");
    }
}